

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xrdopt.c
# Opt level: O1

void read_Xoption(int *argc,char **argv)

{
  int iVar1;
  int iVar2;
  long lVar3;
  size_t sVar4;
  undefined8 uVar5;
  char *pcVar6;
  int *piVar7;
  int iVar8;
  int extraout_EDX;
  long lVar9;
  int iVar10;
  char **ppcVar11;
  ulong uVar12;
  long unaff_R14;
  XrmValue value;
  XrmDatabase rDB;
  XrmDatabase commandlineDB;
  char *str_type [30];
  char tmp [1024];
  uint local_550 [2];
  char *local_548;
  undefined8 local_540;
  undefined8 local_538;
  int *local_530;
  undefined1 local_528 [240];
  undefined8 local_438;
  undefined8 uStack_430;
  undefined3 uStack_428;
  char acStack_425 [1013];
  
  local_538 = 0;
  local_540 = 0;
  lVar9 = (long)*argc;
  local_530 = argc;
  if (1 < lVar9) {
    unaff_R14 = 1;
    do {
      pcVar6 = argv[unaff_R14];
      if (pcVar6 != (char *)0x0) {
        iVar10 = 0x1431b2;
        iVar2 = strcmp(pcVar6,"-help");
        if (iVar2 == 0) goto LAB_00141fb5;
        iVar10 = 0x1431b8;
        iVar2 = strcmp(pcVar6,"-HELP");
        if (iVar2 == 0) goto LAB_00141fb5;
      }
      unaff_R14 = unaff_R14 + 1;
    } while (lVar9 != unaff_R14);
  }
  XrmInitialize();
  XrmParseCommand(&local_538,opTable,0x21,"ldex",local_530,argv);
  iVar10 = 0x149cdd;
  iVar2 = XrmGetResource(local_538,"ldex.help","Ldex.Help",local_528,local_550);
  if (iVar2 == 1) {
LAB_00141fb5:
    print_Xusage(*argv);
  }
  else {
    iVar2 = XrmGetResource(local_538,"ldex.sysout","Ldex.Sysout",local_528,local_550);
    if (iVar2 == 1) {
      strncpy(sysout_name_cl,local_548,(ulong)local_550[0]);
    }
    iVar10 = 0x149d09;
    iVar2 = XrmGetResource(local_538,"ldex.display","Ldex.Display",local_528,local_550);
    if (iVar2 == 1) {
      pcVar6 = local_548;
      strncpy(Display_Name,local_548,(ulong)local_550[0]);
      iVar10 = (int)pcVar6;
    }
    else {
      pcVar6 = getenv("DISPLAY");
      if (pcVar6 == (char *)0x0) goto LAB_00141fc2;
      strcpy(Display_Name,pcVar6);
      iVar10 = (int)pcVar6;
    }
    lVar3 = XOpenDisplay(Display_Name);
    if (lVar3 != 0) {
      uStack_428 = 0x65642d;
      builtin_strncpy(acStack_425,"faults/",8);
      local_438._0_1_ = '/';
      local_438._1_1_ = 'u';
      local_438._2_1_ = 's';
      local_438._3_1_ = 'r';
      local_438._4_1_ = '/';
      local_438._5_1_ = 'l';
      local_438._6_1_ = 'i';
      local_438._7_1_ = 'b';
      uStack_430._0_3_ = 0x31582f;
      uStack_430._3_5_ = 0x7070612f31;
      sVar4 = strlen((char *)&local_438);
      *(undefined4 *)((long)&local_438 + sVar4) = 0x6c64656d;
      *(undefined4 *)((long)&local_438 + sVar4 + 3) = 0x79656c;
      lVar9 = XrmGetFileDatabase(&local_438);
      if (lVar9 != 0) {
        XrmMergeDatabases(lVar9,&local_540);
      }
      lVar9 = XResourceManagerString(lVar3);
      if (lVar9 != 0) {
        uVar5 = XResourceManagerString(lVar3);
        lVar9 = XrmGetStringDatabase(uVar5);
        if (lVar9 != 0) {
          XrmMergeDatabases(lVar9,&local_540);
        }
      }
      XCloseDisplay(lVar3);
      pcVar6 = getenv("HOME");
      strcat((char *)&local_438,pcVar6);
      sVar4 = strlen((char *)&local_438);
      *(undefined8 *)((long)&local_438 + sVar4) = 0x7561666564582e2f;
      *(undefined4 *)((long)&uStack_430 + sVar4) = 0x73746c;
      iVar2 = access((char *)&local_438,4);
      if ((iVar2 != 0) && (lVar9 = XrmGetFileDatabase(&local_438), lVar9 != 0)) {
        XrmMergeDatabases(lVar9,&local_540);
      }
      XrmMergeDatabases(local_538,&local_540);
      iVar2 = XrmGetResource(local_540,"ldex.sysout","Ldex.Sysout",local_528,local_550);
      if (iVar2 == 1) {
        strncpy(sysout_name_xrm,local_548,(ulong)local_550[0]);
      }
      iVar2 = XrmGetResource(local_540,"ldex.title","Ldex.Title",local_528,local_550);
      pcVar6 = local_548;
      if (iVar2 != 1) {
        pcVar6 = "Medley Interlisp";
      }
      strncpy(windowTitle,pcVar6,0xfe);
      iVar2 = XrmGetResource(local_540,"ldex.icontitle","Ldex.icontitle",local_528,local_550);
      if (iVar2 == 1) {
        strncpy(iconTitle,local_548,(ulong)local_550[0]);
      }
      else {
        builtin_strncpy(iconTitle,"Medley",7);
      }
      iVar2 = XrmGetResource(local_540,"ldex.iconbitmap","Ldex.Iconbitmap",local_528,local_550);
      if (iVar2 == 1) {
        strncpy(iconpixmapfile,local_548,(ulong)local_550[0]);
      }
      iVar2 = XrmGetResource(local_540,"ldex.geometry","Ldex.geometry",local_528,local_550);
      if (iVar2 == 1) {
        strncpy((char *)&local_438,local_548,(ulong)local_550[0]);
        XParseGeometry(&local_438,&LispWindowRequestedX,&LispWindowRequestedY,
                       &LispWindowRequestedWidth,&LispWindowRequestedHeight);
      }
      iVar2 = XrmGetResource(local_540,"ldex.screen","Ldex.screen",local_528,local_550);
      if (iVar2 == 1) {
        strncpy((char *)&local_438,local_548,(ulong)local_550[0]);
        XParseGeometry(&local_438,&LispDisplayRequestedX,&LispDisplayRequestedY,
                       &LispDisplayRequestedWidth,&LispDisplayRequestedHeight);
      }
      local_438 = local_438 & 0xffffffffffffff00;
      iVar2 = XrmGetResource(local_540,"ldex.cursorColor","Ldex.cursorColor",local_528,local_550);
      if (iVar2 == 1) {
        strncpy(cursorColor,local_548,0xfe);
      }
      iVar2 = XrmGetResource(local_540,"ldex.foreground","Ldex.foreground",local_528,local_550);
      if (iVar2 == 1) {
        strncpy(foregroundColorName,local_548,0x3f);
      }
      iVar2 = XrmGetResource(local_540,"ldex.background","Ldex.background",local_528,local_550);
      if (iVar2 == 1) {
        strncpy(backgroundColorName,local_548,0x3f);
      }
      iVar2 = XrmGetResource(local_540,"ldex.NoFork","Ldex.NoFork",local_528,local_550);
      if (iVar2 == 1) {
        please_fork = 0;
      }
      iVar2 = XrmGetResource(local_540,"ldex.noscroll","Ldex.noscroll",local_528,local_550);
      if (iVar2 == 1) {
        noscroll = 1;
      }
      iVar2 = XrmGetResource(local_540,"ldex.timer","Ldex.timer",local_528,local_550);
      if (iVar2 == 1) {
        strncpy((char *)&local_438,local_548,(ulong)local_550[0]);
        piVar7 = __errno_location();
        *piVar7 = 0;
        lVar9 = strtol((char *)&local_438,(char **)0x0,10);
        if (0 < (int)lVar9 && *piVar7 == 0) {
          TIMER_INTERVAL = (int)lVar9;
        }
      }
      iVar2 = XrmGetResource(local_540,"ldex.memory","Ldex.memory",local_528,local_550);
      if (iVar2 == 1) {
        strncpy((char *)&local_438,local_548,(ulong)local_550[0]);
        piVar7 = __errno_location();
        *piVar7 = 0;
        lVar9 = strtol((char *)&local_438,(char **)0x0,10);
        if (0 < (int)(uint)lVar9 && *piVar7 == 0) {
          sysout_size = (uint)lVar9;
        }
      }
      iVar2 = XrmGetResource(local_540,"ldex.Init","Ldex.Init",local_528,local_550);
      if (iVar2 == 1) {
        for_makeinit = 1;
      }
      iVar2 = XrmGetResource(local_540,"ldex.xsync","Ldex.xsync",local_528,local_550);
      if (iVar2 == 1) {
        xsync = 1;
      }
      return;
    }
  }
  read_Xoption_cold_2();
LAB_00141fc2:
  ppcVar11 = argv;
  read_Xoption_cold_1();
  iVar2 = *(int *)(ppcVar11 + 0x14) - *(int *)(ppcVar11 + 0x29);
  if (iVar10 < iVar2) {
    iVar2 = iVar10;
  }
  if (iVar10 < 1) {
    iVar2 = 0;
  }
  iVar10 = *(int *)((long)ppcVar11 + 0xa4);
  *(int *)(ppcVar11 + 0x28) = iVar2;
  iVar1 = *(int *)((long)ppcVar11 + 0x14c);
  iVar8 = iVar10 - iVar1;
  if (extraout_EDX < iVar8) {
    iVar8 = extraout_EDX;
  }
  if (extraout_EDX < 1) {
    iVar8 = 0;
  }
  *(int *)((long)ppcVar11 + 0x144) = iVar8;
  uVar12 = (long)(iVar2 * *(int *)(ppcVar11 + 0x29)) / (long)*(int *)(ppcVar11 + 0x14) & 0xffffffff;
  XMoveWindow(ppcVar11[0x1c],ppcVar11[0x21],uVar12,-*(int *)(ppcVar11 + 0x2a),uVar12,iVar1,argv,
              unaff_R14,lVar9);
  XMoveWindow(ppcVar11[0x1c],ppcVar11[0x22],-*(int *)(ppcVar11 + 0x2a),
              (long)(iVar8 * iVar1) / (long)iVar10 & 0xffffffff);
  (*(code *)ppcVar11[0xe])
            (ppcVar11,0,*(undefined4 *)(ppcVar11 + 0x28),*(undefined4 *)((long)ppcVar11 + 0x144),
             *(undefined4 *)(ppcVar11 + 0x29),*(undefined4 *)((long)ppcVar11 + 0x14c));
  return;
}

Assistant:

void read_Xoption(int *argc, char *argv[])
{
  int bitmask;
  XrmDatabase commandlineDB = NULL, applicationDB, serverDB, rDB = NULL;
  XrmValue value;
  char *str_type[30], tmp[1024], *envname;
  Display *xdisplay;
  int i;

  /**********************************************/
  /*                                            */
  /*  Take care of -help flag, which            */
  /*  isn't handled correctly by the X code.    */
  /*                                            */
  /**********************************************/

  for (i = 1; i < *argc; i++) {
    if (argv[i] && ((strcmp(argv[i], "-help") == 0) || (strcmp(argv[i], "-HELP") == 0))) {
      print_Xusage(argv[0]);
      exit(0);
    }
  }

  /* Now let X handle the parsing. */

  (void)XrmInitialize();
/* If the first argv lacks '-' in front it is the sysout. */
#ifdef NEVEFR
  /* JDS 12/20/01: app name should always be "ldex", not what's in argv?? */
  XrmParseCommand(&commandlineDB, opTable, opTableEntries, argv[0], argc, argv);
#endif
  XrmParseCommand(&commandlineDB, opTable, sizeof(opTable) / sizeof(opTable[0]), "ldex", argc, argv);

  if (XrmGetResource(commandlineDB, "ldex.help", "Ldex.Help", str_type, &value) == True) {
    print_Xusage(argv[0]);
  }

  if (XrmGetResource(commandlineDB, "ldex.sysout", "Ldex.Sysout", str_type, &value) == True) {
    /* Get Sysout from command line only */
    (void)strncpy(sysout_name_cl, value.addr, value.size);
  }

  /* In order to access other DB's we have to open the main display now */
  /* This is just temporary. We'll need this display struct to open the */
  /* main databases for medley. After it is used the display will be */
  /* closed and the opening of the other displays will follow the standard */
  /* protocol. */

  if (XrmGetResource(commandlineDB, "ldex.display", "Ldex.Display", str_type, &value) == True) {
    (void)strncpy(Display_Name, value.addr, value.size);
  } else if (getenv("DISPLAY") == (char *)NULL) {
    (void)fprintf(stderr, "Can't find a display. Either set the shell\n");
    (void)fprintf(stderr, "variable DISPLAY to an appropriate display\n");
    (void)fprintf(stderr, "or provide a -display argument.\n");
    print_Xusage(argv[0]);
  } else {
    envname = getenv("DISPLAY");
    (void)strcpy(Display_Name, envname);
  }
  if ((xdisplay = XOpenDisplay(Display_Name)) != NULL) {
    /* read the other databases */
    /* Start with app-defaults/medley */
    (void)strcpy(tmp, "/usr/lib/X11/app-defaults/");
    (void)strcat(tmp, "medley");
    applicationDB = XrmGetFileDatabase(tmp);
    if (applicationDB != NULL) { (void)XrmMergeDatabases(applicationDB, &rDB); }
    /* Then try the displays defaults */
    if (XResourceManagerString(xdisplay) != NULL) {
      serverDB = XrmGetStringDatabase(XResourceManagerString(xdisplay));
      if (serverDB != NULL) { (void)XrmMergeDatabases(serverDB, &rDB); }
    }
    XCloseDisplay(xdisplay);
  } else {
    (void)fprintf(stderr, "Open_Display: cannot connect to display %s.", XDisplayName(Display_Name));
    exit(-1);
  }

  envname = getenv("HOME");
  (void)strcat(tmp, envname);
  (void)strcat(tmp, "/.Xdefaults");
  if (access(tmp, R_OK) != 0) {
    serverDB = XrmGetFileDatabase(tmp);
    if (serverDB != NULL) { (void)XrmMergeDatabases(serverDB, &rDB); }
  }

  /* Now for the commandline */
  (void)XrmMergeDatabases(commandlineDB, &rDB);

  if (XrmGetResource(rDB, "ldex.sysout", "Ldex.Sysout", str_type, &value) == True) {
    /* Get Sysout from x resource manager */
    (void)strncpy(sysout_name_xrm, value.addr, value.size);
  }

  if (XrmGetResource(rDB, "ldex.title", "Ldex.Title", str_type, &value) == True) {
    (void)strncpy(windowTitle, value.addr, sizeof(windowTitle) - 1);
  } else {
    (void)strncpy(windowTitle, WINDOW_NAME, sizeof(windowTitle) - 1);
  }
  if (XrmGetResource(rDB, "ldex.icontitle", "Ldex.icontitle", str_type, &value) == True) {
    (void)strncpy(iconTitle, value.addr, value.size);
  } else {
    (void)strcpy(iconTitle, "Medley");
  }

  if (XrmGetResource(rDB, "ldex.iconbitmap", "Ldex.Iconbitmap", str_type, &value) == True) {
    (void)strncpy(iconpixmapfile, value.addr, value.size);
  }

  /* Old style geometry definition. */
  if (XrmGetResource(rDB, "ldex.geometry", "Ldex.geometry", str_type, &value) == True) {
    /* Get Geometry */
    (void)strncpy(tmp, value.addr, value.size);
    bitmask = XParseGeometry(tmp, &LispWindowRequestedX, &LispWindowRequestedY,
                             &LispWindowRequestedWidth, &LispWindowRequestedHeight);
  }
  if (XrmGetResource(rDB, "ldex.screen", "Ldex.screen", str_type, &value) == True) {
    /* Get Geometry */
    (void)strncpy(tmp, value.addr, value.size);
    bitmask = XParseGeometry(tmp, &LispDisplayRequestedX, &LispDisplayRequestedY,
                             &LispDisplayRequestedWidth, &LispDisplayRequestedHeight);
  }

  (void)strcpy(tmp, ""); /* Clear the string */

  if (XrmGetResource(rDB, "ldex.cursorColor", "Ldex.cursorColor", str_type, &value) == True) {
    (void)strncpy(cursorColor, value.addr, sizeof(cursorColor) - 1);
  }

  if (XrmGetResource(rDB, "ldex.foreground", "Ldex.foreground", str_type, &value) == True) {
    (void)strncpy(foregroundColorName, value.addr, sizeof(foregroundColorName) - 1);
  }

  if (XrmGetResource(rDB, "ldex.background", "Ldex.background", str_type, &value) == True) {
    (void)strncpy(backgroundColorName, value.addr, sizeof(backgroundColorName) - 1);
  }

  if (XrmGetResource(rDB, "ldex.NoFork", "Ldex.NoFork", str_type, &value) == True) {
    please_fork = 0;
  }

  if (XrmGetResource(rDB, "ldex.noscroll", "Ldex.noscroll", str_type, &value) == True) {
    noscroll = 1;
  }

  if (XrmGetResource(rDB, "ldex.timer", "Ldex.timer", str_type, &value) == True) {
    (void)strncpy(tmp, value.addr, value.size);
    errno = 0;
    i = (int)strtol(tmp, (char **)NULL, 10);
    if (errno == 0 && i > 0)
      TIMER_INTERVAL = i;
  }

  /*    if (XrmGetResource(rDB,
                         "ldex.maxpages",
                         "Ldex.maxpages",
                         str_type, &value) == True) {
        (void)strncpy(tmp, value.addr, value.size);
        maxpages = (unsigned)strtol((tmp, (char **)NULL, 10);
	// should check no error here 
      }
  */
  if (XrmGetResource(rDB, "ldex.memory", "Ldex.memory", str_type, &value) == True) {
    (void)strncpy(tmp, value.addr, value.size);
    errno = 0;
    i = (int)strtol(tmp, (char **)NULL, 10);
    if (errno == 0 && i > 0)
      sysout_size = (unsigned)i;
  }

  if (XrmGetResource(rDB, "ldex.Init", "Ldex.Init", str_type, &value) == True) { for_makeinit = 1; }

  if (XrmGetResource(rDB, "ldex.xsync", "Ldex.xsync", str_type, &value) == True) { xsync = True; }
#ifdef MAIKO_ENABLE_ETHERNET
  if (XrmGetResource(rDB, "ldex.EtherNet", "Ldex.EtherNet", str_type, &value) == True) {
    int b0, b1, b2, b3, b4, b5;
    (void)strncpy(tmp, value.addr, value.size);
#if defined(USE_DLPI)
    if (sscanf(tmp, "%d:%x:%x:%x:%x:%x:%x", &ether_fd, &b0, &b1, &b2, &b3, &b4, &b5) == 7)
#elif defined(USE_NIT)
    if (sscanf(tmp, "%d:%x:%x:%x:%x:%x:%x:%s", &ether_fd, &b0, &b1, &b2, &b3, &b4, &b5,
               snit.snit_ifname) == 8)
#endif /* USE_NIT */
    {
      ether_host[0] = b0;
      ether_host[1] = b1;
      ether_host[2] = b2;
      ether_host[3] = b3;
      ether_host[4] = b4;
      ether_host[5] = b5;
    } else {
      (void)fprintf(stderr, "Missing or bogus -E argument\n");
      ether_fd = -1;
      exit(1);
    }
  }
#endif /* MAIKO_ENABLE_ETHERNET */
}